

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O2

QFontEngine * __thiscall QFontPrivate::engineForScript(QFontPrivate *this,int script)

{
  int iVar1;
  QFontEngineData *pQVar2;
  QRecursiveMutex *mutex;
  QFontCache *pQVar3;
  uint script_00;
  QFontEngine *pQVar4;
  long in_FS_OFFSET;
  undefined1 local_38 [16];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  mutex = qt_fontdatabase_mutex();
  QMutexLocker<QRecursiveMutex>::QMutexLocker((QMutexLocker<QRecursiveMutex> *)local_38,mutex);
  script_00 = 2;
  if (3 < script) {
    script_00 = script;
  }
  if (this->engineData != (QFontEngineData *)0x0) {
    iVar1 = this->engineData->fontCacheId;
    pQVar3 = QFontCache::instance();
    pQVar2 = this->engineData;
    if (iVar1 == pQVar3->m_id) {
      if ((pQVar2 != (QFontEngineData *)0x0) &&
         (pQVar4 = pQVar2->engines[script_00], pQVar4 != (QFontEngine *)0x0)) goto LAB_004161a6;
    }
    else {
      LOCK();
      (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i == 0) {
        pQVar2 = this->engineData;
        if (pQVar2 != (QFontEngineData *)0x0) {
          QFontEngineData::~QFontEngineData(pQVar2);
        }
        operator_delete(pQVar2,0x568);
      }
      this->engineData = (QFontEngineData *)0x0;
    }
  }
  QFontDatabasePrivate::load(this,script_00);
  pQVar4 = this->engineData->engines[script_00];
LAB_004161a6:
  QMutexLocker<QRecursiveMutex>::~QMutexLocker((QMutexLocker<QRecursiveMutex> *)local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return pQVar4;
}

Assistant:

QFontEngine *QFontPrivate::engineForScript(int script) const
{
    QMutexLocker locker(qt_fontdatabase_mutex());
    if (script <= QChar::Script_Latin)
        script = QChar::Script_Common;
    if (engineData && engineData->fontCacheId != QFontCache::instance()->id()) {
        // throw out engineData that came from a different thread
        if (!engineData->ref.deref())
            delete engineData;
        engineData = nullptr;
    }
    if (!engineData || !QT_FONT_ENGINE_FROM_DATA(engineData, script))
        QFontDatabasePrivate::load(this, script);
    return QT_FONT_ENGINE_FROM_DATA(engineData, script);
}